

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O0

int CfdFreeBlockHandle(void *handle,void *block_handle)

{
  long in_RSI;
  string *in_stack_00000038;
  CfdException *except;
  exception *std_except;
  CfdCapiBlockData *data;
  int result;
  allocator local_81;
  string local_80 [4];
  uint32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff88;
  void *in_stack_ffffffffffffff90;
  allocator local_51;
  string local_50 [52];
  undefined4 local_1c;
  long local_18;
  
  local_1c = 0xffffffff;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"BlockOpe",&local_51);
    cfd::capi::CheckBuffer(except,in_stack_00000038);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (*(long *)(local_18 + 0x18) != 0) {
      if (*(long **)(local_18 + 0x18) != (long *)0x0) {
        (**(code **)(**(long **)(local_18 + 0x18) + 8))();
      }
      *(undefined8 *)(local_18 + 0x18) = 0;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"BlockOpe",&local_81);
  cfd::capi::FreeBuffer
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return 0;
}

Assistant:

int CfdFreeBlockHandle(void* handle, void* block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (block_handle != nullptr) {
      CheckBuffer(block_handle, kPrefixBlock);
      CfdCapiBlockData* data = static_cast<CfdCapiBlockData*>(block_handle);
      if (data->block != nullptr) {
        delete data->block;
        data->block = nullptr;
      }
    }
    FreeBuffer(block_handle, kPrefixBlock, sizeof(CfdCapiBlockData));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}